

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::check_combinational_loop(Generator *top)

{
  undefined1 local_58 [8];
  CombinationalLoopVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  CombinationalLoopVisitor::CombinationalLoopVisitor((CombinationalLoopVisitor *)local_58);
  IRVisitor::visit_generator_root_tp
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  CombinationalLoopVisitor::~CombinationalLoopVisitor((CombinationalLoopVisitor *)local_58);
  return;
}

Assistant:

void check_combinational_loop(Generator* top) {
    CombinationalLoopVisitor visitor;
    visitor.visit_generator_root_tp(top);
}